

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::AssertionResult>::reset(Option<Catch::AssertionResult> *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    AssertionResult::~AssertionResult((AssertionResult *)0x1ebde6);
  }
  *in_RDI = 0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }